

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPage::setPixmap(QWizardPage *this,WizardPixmap which,QPixmap *pixmap)

{
  long lVar1;
  QWizardPage *pQVar2;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QPixmap::operator=((QPixmap *)(lVar1 + (ulong)which * 0x18 + 0x290),(QPixmap *)pixmap);
  if (*(QWizard **)(lVar1 + 600) != (QWizard *)0x0) {
    pQVar2 = QWizard::currentPage(*(QWizard **)(lVar1 + 600));
    if (pQVar2 == this) {
      QWizardPrivate::updatePixmap(*(QWizardPrivate **)(*(long *)(lVar1 + 600) + 8),which);
      return;
    }
  }
  return;
}

Assistant:

void QWizardPage::setPixmap(QWizard::WizardPixmap which, const QPixmap &pixmap)
{
    Q_D(QWizardPage);
    Q_ASSERT(uint(which) < QWizard::NPixmaps);
    d->pixmaps[which] = pixmap;
    if (d->wizard && d->wizard->currentPage() == this)
        d->wizard->d_func()->updatePixmap(which);
}